

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cpp
# Opt level: O1

bool __thiscall Environment::IsMacro(Environment *this,size_t symbol)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  byte in_CL;
  ulong uVar5;
  __node_base_ptr p_Var6;
  pointer puVar7;
  
  puVar7 = (this->slot_map).
           super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar7 == (this->slot_map).
                  super__Vector_base<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::tuple<bool,_unsigned_long>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::tuple<bool,_unsigned_long>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      in_CL = 0;
      break;
    }
    uVar1 = puVar7[-1]._M_h._M_bucket_count;
    uVar5 = symbol % uVar1;
    p_Var2 = puVar7[-1]._M_h._M_buckets[uVar5];
    p_Var3 = (__node_base_ptr)0x0;
    if ((p_Var2 != (__node_base_ptr)0x0) &&
       (p_Var3 = p_Var2, p_Var6 = p_Var2->_M_nxt,
       p_Var2->_M_nxt[1]._M_nxt != (_Hash_node_base *)symbol)) {
      while (p_Var4 = p_Var6->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
        p_Var3 = (__node_base_ptr)0x0;
        if (((ulong)p_Var4[1]._M_nxt % uVar1 != uVar5) ||
           (p_Var3 = p_Var6, p_Var6 = p_Var4, p_Var4[1]._M_nxt == (_Hash_node_base *)symbol))
        goto LAB_00115f55;
      }
      p_Var3 = (__node_base_ptr)0x0;
    }
LAB_00115f55:
    if (p_Var3 == (__node_base_ptr)0x0) {
      p_Var4 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var4 = p_Var3->_M_nxt;
    }
    if (p_Var4 != (_Hash_node_base *)0x0) {
      in_CL = *(byte *)&p_Var4[3]._M_nxt;
    }
    puVar7 = puVar7 + -1;
  } while (p_Var4 == (_Hash_node_base *)0x0);
  return (bool)(in_CL & 1);
}

Assistant:

bool Environment::IsMacro(size_t symbol) {
  for (auto it = slot_map.rbegin(); it != slot_map.rend(); it++) {
    auto entry = it->find(symbol);
    if (entry != it->end()) {
      return std::get<0>(entry->second);
    }
  }

  // this can happen if we're referencing a unbound identifier.
  // we'll emit an error later. just return false.
  return false;
}